

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O2

int stbrp__skyline_find_min_y(stbrp_context *c,stbrp_node *first,int x0,int width,int *pwaste)

{
  ushort uVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  iVar4 = (int)first;
  uVar7 = (uint)(ushort)c->width;
  uVar2 = 0;
  iVar6 = 0;
  iVar5 = 0;
  while ((int)uVar7 < x0 + iVar4) {
    uVar1 = *(ushort *)((long)&c->width + 2);
    uVar9 = (uint)uVar1;
    if (uVar2 < uVar1) {
      iVar3 = (uVar9 - uVar2) * iVar6;
      c = *(stbrp_context **)&c->align;
      uVar8 = (uint)(ushort)c->width;
      uVar2 = uVar9;
      if ((int)uVar7 < iVar4) {
        iVar10 = uVar8 - iVar4;
        uVar7 = uVar8;
      }
      else {
        iVar10 = uVar8 - uVar7;
        uVar7 = uVar8;
      }
    }
    else {
      c = *(stbrp_context **)&c->align;
      uVar9 = (uint)(ushort)c->width;
      iVar3 = uVar9 - uVar7;
      iVar10 = x0 - iVar6;
      if (iVar3 + iVar6 <= x0) {
        iVar10 = iVar3;
      }
      iVar3 = (uVar2 - uVar1) * iVar10;
      uVar7 = uVar9;
    }
    iVar5 = iVar5 + iVar3;
    iVar6 = iVar6 + iVar10;
  }
  *(int *)CONCAT44(in_register_0000000c,width) = iVar5;
  return uVar2;
}

Assistant:

static int stbrp__skyline_find_min_y(stbrp_context *c, stbrp_node *first, int x0, int width, int *pwaste)
{
   stbrp_node *node = first;
   int x1 = x0 + width;
   int min_y, visited_width, waste_area;

   STBRP__NOTUSED(c);

   STBRP_ASSERT(first->x <= x0);

   #if 0
   // skip in case we're past the node
   while (node->next->x <= x0)
      ++node;
   #else
   STBRP_ASSERT(node->next->x > x0); // we ended up handling this in the caller for efficiency
   #endif

   STBRP_ASSERT(node->x <= x0);

   min_y = 0;
   waste_area = 0;
   visited_width = 0;
   while (node->x < x1) {
      if (node->y > min_y) {
         // raise min_y higher.
         // we've accounted for all waste up to min_y,
         // but we'll now add more waste for everything we've visted
         waste_area += visited_width * (node->y - min_y);
         min_y = node->y;
         // the first time through, visited_width might be reduced
         if (node->x < x0)
            visited_width += node->next->x - x0;
         else
            visited_width += node->next->x - node->x;
      } else {
         // add waste area
         int under_width = node->next->x - node->x;
         if (under_width + visited_width > width)
            under_width = width - visited_width;
         waste_area += under_width * (min_y - node->y);
         visited_width += under_width;
      }
      node = node->next;
   }

   *pwaste = waste_area;
   return min_y;
}